

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O3

size_t EntityRelationTask::predict_relation
                 (search *sch,example *ex,v_array<unsigned_long> *predictions,ptag my_tag,bool isLdf
                 )

{
  uint uVar1;
  float *pfVar2;
  byte *pbVar3;
  long *plVar4;
  example *input_example;
  bool bVar5;
  uint uVar6;
  action aVar7;
  predictor *ppVar8;
  byte *pbVar9;
  long lVar10;
  long *plVar11;
  undefined7 in_register_00000081;
  unsigned_long ent1_id;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  search *this;
  float loss;
  char type;
  int id2;
  int id1;
  v_array<unsigned_int> star_labels;
  char local_181;
  example *local_180;
  ptag local_178;
  ptag local_174;
  search *local_170;
  v_array<unsigned_int> local_168;
  unsigned_long local_148;
  undefined4 local_13c;
  v_array<unsigned_int> local_138;
  predictor local_118;
  
  pfVar2 = (float *)sch->task_data;
  local_180 = ex;
  decode_tag(ex->tag,&local_181,(int *)&local_174,(int *)&local_178);
  local_168.end_array = (uint *)0x0;
  local_168.erase_count = 0;
  local_168._begin = (uint *)0x0;
  local_168._end = (uint *)0x0;
  local_13c = (undefined4)CONCAT71(in_register_00000081,isLdf);
  if (*(char *)(pfVar2 + 4) == '\x01') {
    ent1_id = predictions->_begin[(int)local_174];
    if (ent1_id != 0) {
      local_148 = predictions->_begin[(int)local_178];
      if (local_148 == 0) {
        ent1_id = 0;
      }
      goto LAB_002805a3;
    }
  }
  ent1_id = 0;
  local_148 = 0;
LAB_002805a3:
  lVar10 = *(long *)(pfVar2 + 0xe);
  lVar13 = *(long *)(pfVar2 + 0x10);
  local_170 = sch;
  if (lVar13 != lVar10) {
    lVar14 = 0;
    uVar12 = 0;
    do {
      if (((*(char *)(pfVar2 + 4) != '\x01') || (ent1_id == 0)) ||
         (bVar5 = check_constraints(ent1_id,local_148,(ulong)*(uint *)(lVar10 + uVar12 * 4)), bVar5)
         ) {
        v_array<unsigned_int>::push_back(&local_168,(uint *)(lVar10 + lVar14));
        lVar10 = *(long *)(pfVar2 + 0xe);
        lVar13 = *(long *)(pfVar2 + 0x10);
      }
      uVar12 = uVar12 + 1;
      lVar14 = lVar14 + 4;
    } while (uVar12 < (ulong)(lVar13 - lVar10 >> 2));
  }
  this = local_170;
  input_example = local_180;
  if (*(char *)((long)pfVar2 + 0x11) == '\0') {
    if ((char)local_13c == '\0') {
      Search::predictor::predictor(&local_118,local_170,my_tag);
      ppVar8 = Search::predictor::set_input(&local_118,local_180);
      ppVar8 = Search::predictor::set_oracle(ppVar8,(local_180->l).multi.label);
      ppVar8 = Search::predictor::set_allowed(ppVar8,&local_168);
      ppVar8 = Search::predictor::set_learner_id(ppVar8,1);
      uVar6 = Search::predictor::predict(ppVar8);
      Search::predictor::~predictor(&local_118);
    }
    else {
      if (local_168._end == local_168._begin) {
        aVar7 = 0;
      }
      else {
        uVar12 = 0;
        uVar15 = 0;
        do {
          lVar13 = uVar12 * 0x68d0;
          VW::copy_example_data(false,(example *)(*(long *)(pfVar2 + 0x1a) + lVar13),local_180);
          lVar10 = *(long *)(pfVar2 + 0x1a);
          pbVar9 = *(byte **)(lVar10 + lVar13);
          pbVar3 = *(byte **)(lVar10 + 8 + lVar13);
          if (pbVar9 != pbVar3) {
            uVar6 = local_168._begin[uVar12];
            do {
              plVar4 = *(long **)(lVar10 + lVar13 + 0x48 + (ulong)*pbVar9 * 0x68);
              for (plVar11 = *(long **)(lVar10 + lVar13 + 0x40 + (ulong)*pbVar9 * 0x68);
                  plVar11 != plVar4; plVar11 = plVar11 + 1) {
                *plVar11 = *plVar11 * 0x1b90d09 + (ulong)uVar6 * 0x49be95;
              }
              pbVar9 = pbVar9 + 1;
            } while (pbVar9 != pbVar3);
            lVar10 = *(long *)(pfVar2 + 0x1a);
          }
          **(undefined4 **)(lVar10 + 0x6828 + lVar13) = 0;
          *(uint *)(*(long *)(lVar10 + 0x6828 + lVar13) + 4) = local_168._begin[uVar12];
          *(undefined4 *)(*(long *)(lVar10 + 0x6828 + lVar13) + 8) = 0;
          *(undefined4 *)(*(long *)(lVar10 + 0x6828 + lVar13) + 0xc) = 0;
          if (local_168._begin[uVar12] == (local_180->l).multi.label) {
            uVar15 = uVar12 & 0xffffffff;
          }
          aVar7 = (action)uVar15;
          uVar12 = uVar12 + 1;
        } while (uVar12 < (ulong)((long)local_168._end - (long)local_168._begin >> 2));
      }
      Search::predictor::predictor(&local_118,local_170,my_tag);
      ppVar8 = Search::predictor::set_input
                         (&local_118,*(example **)(pfVar2 + 0x1a),
                          (long)local_168._end - (long)local_168._begin >> 2);
      ppVar8 = Search::predictor::set_oracle(ppVar8,aVar7);
      ppVar8 = Search::predictor::set_learner_id(ppVar8,2);
      aVar7 = Search::predictor::predict(ppVar8);
      Search::predictor::~predictor(&local_118);
      uVar6 = local_168._begin[aVar7];
      this = local_170;
    }
  }
  else {
    local_138.end_array = (uint *)0x0;
    local_138.erase_count = 0;
    local_138._begin = (uint *)0x0;
    local_138._end = (uint *)0x0;
    v_array<unsigned_int>::push_back(&local_138,(uint *)&(local_180->l).empty);
    local_118.is_ldf = true;
    local_118._1_3_ = 0;
    v_array<unsigned_int>::push_back(&local_138,(uint *)&local_118);
    local_118.is_ldf = true;
    local_118._1_3_ = 0;
    v_array<unsigned_int>::push_back(&local_168,(uint *)&local_118);
    this = local_170;
    Search::predictor::predictor(&local_118,local_170,my_tag);
    ppVar8 = Search::predictor::set_input(&local_118,input_example);
    ppVar8 = Search::predictor::set_oracle(ppVar8,&local_138);
    ppVar8 = Search::predictor::set_allowed(ppVar8,&local_168);
    ppVar8 = Search::predictor::set_learner_id(ppVar8,2);
    ppVar8 = Search::predictor::add_condition(ppVar8,local_174,'a');
    ppVar8 = Search::predictor::add_condition(ppVar8,local_178,'b');
    uVar6 = Search::predictor::predict(ppVar8);
    Search::predictor::~predictor(&local_118);
    local_168._end = local_168._end + -1;
  }
  if (uVar6 == 0xb) {
    loss = pfVar2[3];
  }
  else {
    uVar1 = (local_180->l).multi.label;
    loss = 0.0;
    if (uVar6 != uVar1) {
      if (uVar1 == 10) {
        loss = *pfVar2;
      }
      else {
        loss = pfVar2[2];
      }
    }
  }
  Search::search::loss(this,loss);
  if (local_168._begin != (uint *)0x0) {
    free(local_168._begin);
  }
  return (ulong)uVar6;
}

Assistant:

size_t predict_relation(Search::search& sch, example* ex, v_array<size_t>& predictions, ptag my_tag, bool isLdf = false)
{
  char type;
  int id1, id2;
  task_data* my_task_data = sch.get_task_data<task_data>();
  size_t hist[2];
  decode_tag(ex->tag, type, id1, id2);
  v_array<uint32_t> constrained_relation_labels = v_init<uint32_t>();
  if (my_task_data->constraints && predictions[id1] != 0 && predictions[id2] != 0)
  {
    hist[0] = predictions[id1];
    hist[1] = predictions[id2];
  }
  else
  {
    hist[0] = 0;
    hist[1] = 0;
  }
  for (size_t j = 0; j < my_task_data->y_allowed_relation.size(); j++)
  {
    if (!my_task_data->constraints || hist[0] == (size_t)0 ||
        check_constraints(hist[0], hist[1], my_task_data->y_allowed_relation[j]))
      constrained_relation_labels.push_back(my_task_data->y_allowed_relation[j]);
  }

  size_t prediction;
  if (my_task_data->allow_skip)
  {
    v_array<uint32_t> star_labels = v_init<uint32_t>();
    star_labels.push_back(ex->l.multi.label);
    star_labels.push_back(LABEL_SKIP);
    constrained_relation_labels.push_back(LABEL_SKIP);
    prediction = Search::predictor(sch, my_tag)
                     .set_input(*ex)
                     .set_oracle(star_labels)
                     .set_allowed(constrained_relation_labels)
                     .set_learner_id(2)
                     .add_condition(id1, 'a')
                     .add_condition(id2, 'b')
                     .predict();
    constrained_relation_labels.pop();
  }
  else
  {
    if (isLdf)
    {
      int correct_label = 0;  // if correct label is not in the set, use the first one
      for (size_t a = 0; a < constrained_relation_labels.size(); a++)
      {
        VW::copy_example_data(false, &my_task_data->ldf_relation[a], ex);
        update_example_indicies(
            true, &my_task_data->ldf_relation[a], 28904713, 4832917 * (uint64_t)(constrained_relation_labels[a]));
        CS::label& lab = my_task_data->ldf_relation[a].l.cs;
        lab.costs[0].x = 0.f;
        lab.costs[0].class_index = constrained_relation_labels[a];
        lab.costs[0].partial_prediction = 0.f;
        lab.costs[0].wap_value = 0.f;
        if (constrained_relation_labels[a] == ex->l.multi.label)
        {
          correct_label = (int)a;
        }
      }
      size_t pred_pos = Search::predictor(sch, my_tag)
                            .set_input(my_task_data->ldf_relation, constrained_relation_labels.size())
                            .set_oracle(correct_label)
                            .set_learner_id(2)
                            .predict();
      prediction = constrained_relation_labels[pred_pos];
    }
    else
    {
      prediction = Search::predictor(sch, my_tag)
                       .set_input(*ex)
                       .set_oracle(ex->l.multi.label)
                       .set_allowed(constrained_relation_labels)
                       .set_learner_id(1)
                       .predict();
    }
  }

  float loss = 0.0;
  if (prediction == LABEL_SKIP)
  {
    loss = my_task_data->skip_cost;
  }
  else if (prediction != ex->l.multi.label)
  {
    if (ex->l.multi.label == R_NONE)
    {
      loss = my_task_data->relation_none_cost;
    }
    else
    {
      loss = my_task_data->relation_cost;
    }
  }
  sch.loss(loss);
  constrained_relation_labels.delete_v();
  return prediction;
}